

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QByteArray * __thiscall
QStringBuilder<QStringBuilder<const_char_(&)[20],_QByteArray_&>,_const_char_(&)[2]>::
convertTo<QByteArray>
          (QByteArray *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<const_char_(&)[20],_QByteArray_&>,_const_char_(&)[2]> *this)

{
  char cVar1;
  char *pcVar2;
  QByteArray *pQVar3;
  size_t __n;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  
  lVar5 = (((this->a).b)->d).size + 0x14;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,lVar5,Uninitialized);
  pcVar2 = (__return_storage_ptr__->d).ptr;
  pcVar4 = *(this->a).a;
  cVar1 = *pcVar4;
  pcVar6 = pcVar2;
  while (cVar1 != '\0') {
    pcVar4 = pcVar4 + 1;
    *pcVar6 = cVar1;
    pcVar6 = pcVar6 + 1;
    cVar1 = *pcVar4;
  }
  pQVar3 = (this->a).b;
  __n = (pQVar3->d).size;
  if (__n != 0) {
    memcpy(pcVar6,(pQVar3->d).ptr,__n);
  }
  pcVar6 = pcVar6 + __n;
  pcVar4 = *this->b;
  cVar1 = *pcVar4;
  while (cVar1 != '\0') {
    pcVar4 = pcVar4 + 1;
    *pcVar6 = cVar1;
    pcVar6 = pcVar6 + 1;
    cVar1 = *pcVar4;
  }
  if (lVar5 != (long)pcVar6 - (long)pcVar2) {
    QByteArray::resize((longlong)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }